

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

IntegerLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::IntegerLiteral,slang::ast::Compilation&,slang::ast::Type_const&,slang::SVInt_const&,bool,slang::SourceRange>
          (BumpAllocator *this,Compilation *args,Type *args_1,SVInt *args_2,bool *args_3,
          SourceRange *args_4)

{
  IntegerLiteral *this_00;
  
  this_00 = (IntegerLiteral *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((IntegerLiteral *)this->endPtr < this_00 + 1) {
    this_00 = (IntegerLiteral *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  ast::IntegerLiteral::IntegerLiteral
            (this_00,&args->super_BumpAllocator,args_1,args_2,*args_3,*args_4);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }